

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entries.cpp
# Opt level: O3

ScalarFunction * duckdb::MapEntriesFun::GetFunction(void)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  LogicalType varargs;
  ScalarFunction *in_RDI;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  undefined1 null_handling;
  undefined8 bind_lambda;
  vector<duckdb::LogicalType,_true> local_88;
  LogicalType local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_68,LIST);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 0x27;
  LogicalType::LogicalType(&local_50,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_50;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff44;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff4c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_88,&local_68,(scalar_function_t *)&stack0xffffffffffffff58,MapEntriesBind
             ,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,null_handling,
             (bind_lambda_function_t)bind_lambda);
  LogicalType::~LogicalType(&local_50);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff58,(_Any_data *)&stack0xffffffffffffff58,
               __destroy_functor);
  LogicalType::~LogicalType(&local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  LogicalType::LogicalType(&local_38,ANY);
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.id_ = local_38.id_;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.physical_type_ =
       local_38.physical_type_;
  peVar1 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_38.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_38.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_38);
  return in_RDI;
}

Assistant:

ScalarFunction MapEntriesFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction fun({}, LogicalTypeId::LIST, MapEntriesFunction, MapEntriesBind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.varargs = LogicalType::ANY;
	return fun;
}